

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logging.cpp
# Opt level: O2

LogLevels __thiscall helics::logLevelFromString(helics *this,string_view level)

{
  int defValue;
  LogLevels LVar1;
  const_iterator cVar2;
  string_view V;
  basic_string_view<char,_std::char_traits<char>_> bVar3;
  allocator<char> local_39;
  string_view level_local;
  key_type local_28;
  
  level_local._M_str = (char *)level._M_len;
  level_local._M_len = (size_t)this;
  std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
            ((string *)&local_28,(basic_string_view<char,_std::char_traits<char>_> *)&level_local,
             &local_39);
  cVar2 = CLI::std::
          _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
          ::find((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                  *)gLogLevelMap_abi_cxx11_,&local_28);
  std::__cxx11::string::~string((string *)&local_28);
  if (cVar2.
      super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_true>
      ._M_cur == (__node_type *)0x0) {
    defValue = CLI::std::basic_string_view<char,_std::char_traits<char>_>::compare
                         ((basic_string_view<char,_std::char_traits<char>_> *)&level_local,0,9,
                          "loglevel_");
    LVar1 = 0xfff0bdc1;
    if (defValue == 0) {
      bVar3 = CLI::std::basic_string_view<char,_std::char_traits<char>_>::substr
                        ((basic_string_view<char,_std::char_traits<char>_> *)&level_local,9,
                         0xffffffffffffffff);
      V._M_str = (char *)0xfff0bdc1;
      V._M_len = (size_t)bVar3._M_str;
      LVar1 = gmlc::utilities::numeric_conversion<int>((utilities *)bVar3._M_len,V,defValue);
    }
  }
  else {
    LVar1 = *(LogLevels *)
             ((long)cVar2.
                    super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_true>
                    ._M_cur + 0x28);
  }
  return LVar1;
}

Assistant:

LogLevels logLevelFromString(std::string_view level)
{
    auto res = gLogLevelMap.find(std::string(level));
    if (res != gLogLevelMap.end()) {
        return static_cast<LogLevels>(res->second);
    }
    if (level.compare(0, 9, "loglevel_") == 0) {
        return static_cast<LogLevels>(
            gmlc::utilities::numeric_conversion<int>(level.substr(9), -999999));
    } else {
        return static_cast<LogLevels>(-999999);
    }
}